

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getRangingInterface(Highs *this)

{
  HighsStatus HVar1;
  long in_RDI;
  HighsLpSolverObject solver_object;
  HighsLpSolverObject *in_stack_000015c0;
  HighsRanging *in_stack_000015c8;
  HighsLpSolverObject local_50;
  
  HighsLpSolverObject::HighsLpSolverObject
            (&local_50,(HighsLp *)(in_RDI + 0x138),(HighsBasis *)(in_RDI + 0x70),
             (HighsSolution *)(in_RDI + 8),(HighsInfo *)(in_RDI + 0xea8),(HEkk *)(in_RDI + 0x12f8),
             (HighsCallback *)(in_RDI + 0x9a8),(HighsOptions *)(in_RDI + 0xaa8),
             (HighsTimer *)(in_RDI + 0x920));
  local_50.model_status_ = *(HighsModelStatus *)(in_RDI + 0x1244);
  HVar1 = getRangingData(in_stack_000015c8,in_stack_000015c0);
  return HVar1;
}

Assistant:

HighsStatus Highs::getRangingInterface() {
  HighsLpSolverObject solver_object(model_.lp_, basis_, solution_, info_,
                                    ekk_instance_, callback_, options_, timer_);
  solver_object.model_status_ = model_status_;
  return getRangingData(this->ranging_, solver_object);
}